

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

VarnodeTpl * __thiscall StartSymbol::getVarnode(StartSymbol *this)

{
  VarnodeTpl *this_00;
  undefined1 local_70 [8];
  ConstTpl sz_zero;
  ConstTpl off;
  ConstTpl spc;
  StartSymbol *this_local;
  
  ConstTpl::ConstTpl((ConstTpl *)&off.select,this->const_space);
  ConstTpl::ConstTpl((ConstTpl *)&sz_zero.select,j_start);
  ConstTpl::ConstTpl((ConstTpl *)local_70);
  this_00 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl
            (this_00,(ConstTpl *)&off.select,(ConstTpl *)&sz_zero.select,(ConstTpl *)local_70);
  return this_00;
}

Assistant:

VarnodeTpl *StartSymbol::getVarnode(void) const

{ // Returns current instruction offset as a constant
  ConstTpl spc(const_space);
  ConstTpl off(ConstTpl::j_start);
  ConstTpl sz_zero;
  return new VarnodeTpl(spc,off,sz_zero);
}